

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqComms::~ZmqComms(ZmqComms *this)

{
  ~ZmqComms(this);
  operator_delete(this,0x4c0);
  return;
}

Assistant:

ZmqComms::~ZmqComms()
{
    disconnect();
}